

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O1

void Pdr_ManStop(Pdr_Man_t *p)

{
  void *pvVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  void **ppvVar4;
  Vec_Wec_t *__ptr;
  uint *__ptr_00;
  bool bVar5;
  undefined8 in_RAX;
  undefined4 uVar7;
  Vec_Vec_t *pVVar6;
  int level;
  Aig_Man_t *p_00;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  uVar7 = (undefined4)((ulong)in_RAX >> 0x20);
  p_00 = p->pAig;
  Aig_ManCleanMarkAB(p_00);
  level = (int)p_00;
  if (p->pPars->fVerbose != 0) {
    Abc_Print(level,"Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Start =%4d\n",
              ((double)p->nCallsS * 100.0) / (double)p->nCalls,(ulong)(uint)p->nBlocks,
              (ulong)(uint)p->nObligs,(ulong)(uint)p->nCubes,(ulong)(uint)p->nCalls,
              CONCAT44(uVar7,p->nStarts));
    Abc_Print(level,"%s =","SAT solving");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSat / 1000000.0,dVar11);
    Abc_Print(level,"%s =","  unsat    ");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tSatUnsat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSatUnsat / 1000000.0,dVar11);
    Abc_Print(level,"%s =","  sat      ");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tSatSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSatSat / 1000000.0,dVar11);
    Abc_Print(level,"%s =","Generalize ");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tGeneral * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tGeneral / 1000000.0,dVar11);
    Abc_Print(level,"%s =","Push clause");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tPush * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tPush / 1000000.0,dVar11);
    Abc_Print(level,"%s =","Ternary sim");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tTsim * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tTsim / 1000000.0,dVar11);
    Abc_Print(level,"%s =","Containment");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tContain * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tContain / 1000000.0,dVar11);
    Abc_Print(level,"%s =","CNF compute");
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = ((double)p->tCnf * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tCnf / 1000000.0,dVar11);
    Abc_Print(level,"%s =","TOTAL      ");
    dVar11 = (double)p->tTotal;
    dVar12 = 0.0;
    if (p->tTotal != 0) {
      dVar12 = (dVar11 * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar11 / 1000000.0,dVar12);
    fflush(_stdout);
  }
  pVVar8 = p->vSolvers;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      sat_solver_delete((sat_solver *)pVVar8->pArray[lVar10]);
      lVar10 = lVar10 + 1;
      pVVar8 = p->vSolvers;
    } while (lVar10 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (void **)0x0;
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  pVVar6 = p->vClauses;
  if (pVVar6->nSize < 1) {
    bVar5 = false;
  }
  else {
    lVar10 = 0;
    do {
      pVVar6 = p->vClauses;
      if (pVVar6->nSize <= lVar10) {
LAB_0056fb37:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      lVar9 = 0;
      while (lVar9 < *(int *)((long)pVVar6->pArray[lVar10] + 4)) {
        Pdr_SetDeref(*(Pdr_Set_t **)(*(long *)((long)pVVar6->pArray[lVar10] + 8) + lVar9 * 8));
        lVar9 = lVar9 + 1;
        pVVar6 = p->vClauses;
        if (pVVar6->nSize <= lVar10) goto LAB_0056fb37;
      }
      lVar10 = lVar10 + 1;
      pVVar6 = p->vClauses;
    } while (lVar10 < pVVar6->nSize);
    bVar5 = 0 < pVVar6->nSize;
  }
  if (bVar5) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar10];
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        free(pvVar1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar6->nSize);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Vec_t *)0x0) {
    free(pVVar6);
  }
  Pdr_QueueStop(p);
  if (p->pOrder != (int *)0x0) {
    free(p->pOrder);
    p->pOrder = (int *)0x0;
  }
  pVVar2 = p->vActVars;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  Cnf_DataFree(p->pCnf1);
  if (p->vVar2Reg != (Vec_Int_t *)0x0) {
    piVar3 = p->vVar2Reg->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vVar2Reg->pArray = (int *)0x0;
    }
    if (p->vVar2Reg != (Vec_Int_t *)0x0) {
      free(p->vVar2Reg);
      p->vVar2Reg = (Vec_Int_t *)0x0;
    }
  }
  Cnf_DataFree(p->pCnf2);
  if ((p->pvId2Vars != (Vec_Int_t *)0x0) && (0 < p->pAig->vObjs->nSize)) {
    lVar10 = 8;
    lVar9 = 0;
    do {
      pvVar1 = *(void **)((long)&p->pvId2Vars->nCap + lVar10);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)&p->pvId2Vars->nCap + lVar10) = 0;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar9 < p->pAig->vObjs->nSize);
  }
  if (p->pvId2Vars != (Vec_Int_t *)0x0) {
    free(p->pvId2Vars);
    p->pvId2Vars = (Vec_Int_t *)0x0;
  }
  if (0 < (p->vVar2Ids).nSize) {
    lVar10 = 0;
    do {
      pvVar1 = (p->vVar2Ids).pArray[lVar10];
      if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar1 + 8));
        *(undefined8 *)((long)pvVar1 + 8) = 0;
      }
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vVar2Ids).nSize);
  }
  ppvVar4 = (p->vVar2Ids).pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
    (p->vVar2Ids).pArray = (void **)0x0;
  }
  __ptr = p->vVLits;
  if (__ptr != (Vec_Wec_t *)0x0) {
    if (0 < __ptr->nCap) {
      lVar9 = 8;
      lVar10 = 0;
      do {
        pvVar1 = *(void **)((long)&__ptr->pArray->nCap + lVar9);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          *(undefined8 *)((long)&__ptr->pArray->nCap + lVar9) = 0;
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar10 < __ptr->nCap);
    }
    if (__ptr->pArray != (Vec_Int_t *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (Vec_Int_t *)0x0;
    }
    __ptr->nCap = 0;
    __ptr->nSize = 0;
    free(__ptr);
    p->vVLits = (Vec_Wec_t *)0x0;
  }
  Cnf_ManStop(p->pCnfMan);
  if (p->vPrio != (Vec_Int_t *)0x0) {
    piVar3 = p->vPrio->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vPrio->pArray = (int *)0x0;
    }
    if (p->vPrio != (Vec_Int_t *)0x0) {
      free(p->vPrio);
      p->vPrio = (Vec_Int_t *)0x0;
    }
  }
  pVVar2 = p->vLits;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCiObjs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCoObjs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCiVals;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCoVals;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vNodes;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vUndo;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vVisits;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCi2Rem;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vRes;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vSuppLits;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  if (p->vInfCubes != (Vec_Ptr_t *)0x0) {
    ppvVar4 = p->vInfCubes->pArray;
    if (ppvVar4 != (void **)0x0) {
      free(ppvVar4);
      p->vInfCubes->pArray = (void **)0x0;
    }
    if (p->vInfCubes != (Vec_Ptr_t *)0x0) {
      free(p->vInfCubes);
      p->vInfCubes = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->pCubeJust != (Pdr_Set_t *)0x0) {
    free(p->pCubeJust);
    p->pCubeJust = (Pdr_Set_t *)0x0;
  }
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar8 = p->vCexes;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar8->nSize) {
      lVar10 = 0;
      do {
        if ((void *)0x2 < pVVar8->pArray[lVar10]) {
          free(pVVar8->pArray[lVar10]);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar8->nSize);
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      pVVar8->pArray = (void **)0x0;
    }
    free(pVVar8);
  }
  if (p->pAig->pFanData != (int *)0x0) {
    Aig_ManFanoutStop(p->pAig);
  }
  __ptr_00 = p->pAig->pTerSimData;
  if (__ptr_00 != (uint *)0x0) {
    free(__ptr_00);
    p->pAig->pTerSimData = (uint *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Pdr_ManStop( Pdr_Man_t * p )
{
    Pdr_Set_t * pCla;
    sat_solver * pSat;
    int i, k;
    Aig_ManCleanMarkAB( p->pAig );
    if ( p->pPars->fVerbose ) 
    {
        Abc_Print( 1, "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Start =%4d\n", 
            p->nBlocks, p->nObligs, p->nCubes, p->nCalls, 100.0 * p->nCallsS / p->nCalls, p->nStarts );
        ABC_PRTP( "SAT solving", p->tSat,       p->tTotal );
        ABC_PRTP( "  unsat    ", p->tSatUnsat,  p->tTotal );
        ABC_PRTP( "  sat      ", p->tSatSat,    p->tTotal );
        ABC_PRTP( "Generalize ", p->tGeneral,   p->tTotal );
        ABC_PRTP( "Push clause", p->tPush,      p->tTotal );
        ABC_PRTP( "Ternary sim", p->tTsim,      p->tTotal );
        ABC_PRTP( "Containment", p->tContain,   p->tTotal );
        ABC_PRTP( "CNF compute", p->tCnf,       p->tTotal );
        ABC_PRTP( "TOTAL      ", p->tTotal,     p->tTotal );
        fflush( stdout );
    }
//    Abc_Print( 1, "SS =%6d. SU =%6d. US =%6d. UU =%6d.\n", p->nCasesSS, p->nCasesSU, p->nCasesUS, p->nCasesUU );
    Vec_PtrForEachEntry( sat_solver *, p->vSolvers, pSat, i )
        sat_solver_delete( pSat );
    Vec_PtrFree( p->vSolvers );
    Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pCla, i, k )
        Pdr_SetDeref( pCla );
    Vec_VecFree( p->vClauses );
    Pdr_QueueStop( p );
    ABC_FREE( p->pOrder );
    Vec_IntFree( p->vActVars );
    // static CNF
    Cnf_DataFree( p->pCnf1 );
    Vec_IntFreeP( &p->vVar2Reg );
    // dynamic CNF
    Cnf_DataFree( p->pCnf2 );
    if ( p->pvId2Vars )
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        ABC_FREE( p->pvId2Vars[i].pArray );
    ABC_FREE( p->pvId2Vars );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vVar2Ids );
    for ( i = 0; i < Vec_PtrSize(&p->vVar2Ids); i++ )
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids, i) );
    ABC_FREE( p->vVar2Ids.pArray );
    Vec_WecFreeP( &p->vVLits );
    // CNF manager
    Cnf_ManStop( p->pCnfMan );
    // internal use
    Vec_IntFreeP( &p->vPrio   );  // priority flops
    Vec_IntFree( p->vLits     );  // array of literals
    Vec_IntFree( p->vCiObjs   );  // cone leaves
    Vec_IntFree( p->vCoObjs   );  // cone roots
    Vec_IntFree( p->vCiVals   );  // cone leaf values
    Vec_IntFree( p->vCoVals   );  // cone root values
    Vec_IntFree( p->vNodes    );  // cone nodes
    Vec_IntFree( p->vUndo     );  // cone undos
    Vec_IntFree( p->vVisits   );  // intermediate
    Vec_IntFree( p->vCi2Rem   );  // CIs to be removed
    Vec_IntFree( p->vRes      );  // final result
    Vec_IntFree( p->vSuppLits );  // support literals
    Vec_PtrFreeP( &p->vInfCubes );
    ABC_FREE( p->pCubeJust );
    ABC_FREE( p->pTime4Outs );
    if ( p->vCexes )
        Vec_PtrFreeFree( p->vCexes );
    // additional AIG data-members
    if ( p->pAig->pFanData != NULL )
        Aig_ManFanoutStop( p->pAig );
    if ( p->pAig->pTerSimData != NULL )
        ABC_FREE( p->pAig->pTerSimData );
    ABC_FREE( p );
}